

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  int iVar1;
  ImDrawListSharedData *pIVar2;
  ImDrawCmd *pIVar3;
  unsigned_short *puVar4;
  ImDrawVert *pIVar5;
  ImDrawList *__s;
  ImDrawCmd *pIVar6;
  unsigned_short *puVar7;
  ImDrawVert *pIVar8;
  int iVar9;
  
  __s = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar2 = this->_Data;
  (__s->_Splitter)._Current = 0;
  (__s->_Splitter)._Count = 0;
  (__s->_Splitter)._Channels.Size = 0;
  (__s->_Splitter)._Channels.Capacity = 0;
  (__s->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
  memset(__s,0,200);
  __s->_Data = pIVar2;
  pIVar6 = (__s->CmdBuffer).Data;
  if (pIVar6 != (ImDrawCmd *)0x0) {
    (__s->CmdBuffer).Size = 0;
    (__s->CmdBuffer).Capacity = 0;
    ImGui::MemFree(pIVar6);
    (__s->CmdBuffer).Data = (ImDrawCmd *)0x0;
  }
  iVar1 = (this->CmdBuffer).Size;
  iVar9 = (__s->CmdBuffer).Capacity;
  if (iVar9 < iVar1) {
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar9 <= iVar1) {
      iVar9 = iVar1;
    }
    pIVar6 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x38);
    pIVar3 = (__s->CmdBuffer).Data;
    if (pIVar3 != (ImDrawCmd *)0x0) {
      memcpy(pIVar6,pIVar3,(long)(__s->CmdBuffer).Size * 0x38);
      ImGui::MemFree((__s->CmdBuffer).Data);
    }
    (__s->CmdBuffer).Data = pIVar6;
    (__s->CmdBuffer).Capacity = iVar9;
  }
  else {
    pIVar6 = (ImDrawCmd *)0x0;
  }
  (__s->CmdBuffer).Size = iVar1;
  pIVar3 = (this->CmdBuffer).Data;
  if (pIVar3 != (ImDrawCmd *)0x0) {
    memcpy(pIVar6,pIVar3,(long)iVar1 * 0x38);
  }
  puVar7 = (__s->IdxBuffer).Data;
  if (puVar7 != (unsigned_short *)0x0) {
    (__s->IdxBuffer).Size = 0;
    (__s->IdxBuffer).Capacity = 0;
    ImGui::MemFree(puVar7);
    (__s->IdxBuffer).Data = (unsigned_short *)0x0;
  }
  iVar1 = (this->IdxBuffer).Size;
  iVar9 = (__s->IdxBuffer).Capacity;
  if (iVar9 < iVar1) {
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar9 <= iVar1) {
      iVar9 = iVar1;
    }
    puVar7 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
    puVar4 = (__s->IdxBuffer).Data;
    if (puVar4 != (unsigned_short *)0x0) {
      memcpy(puVar7,puVar4,(long)(__s->IdxBuffer).Size * 2);
      ImGui::MemFree((__s->IdxBuffer).Data);
    }
    (__s->IdxBuffer).Data = puVar7;
    (__s->IdxBuffer).Capacity = iVar9;
  }
  else {
    puVar7 = (unsigned_short *)0x0;
  }
  (__s->IdxBuffer).Size = iVar1;
  puVar4 = (this->IdxBuffer).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    memcpy(puVar7,puVar4,(long)iVar1 * 2);
  }
  pIVar8 = (__s->VtxBuffer).Data;
  if (pIVar8 != (ImDrawVert *)0x0) {
    (__s->VtxBuffer).Size = 0;
    (__s->VtxBuffer).Capacity = 0;
    ImGui::MemFree(pIVar8);
    (__s->VtxBuffer).Data = (ImDrawVert *)0x0;
  }
  iVar1 = (this->VtxBuffer).Size;
  iVar9 = (__s->VtxBuffer).Capacity;
  if (iVar9 < iVar1) {
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar9 <= iVar1) {
      iVar9 = iVar1;
    }
    pIVar8 = (ImDrawVert *)ImGui::MemAlloc((long)iVar9 * 0x14);
    pIVar5 = (__s->VtxBuffer).Data;
    if (pIVar5 != (ImDrawVert *)0x0) {
      memcpy(pIVar8,pIVar5,(long)(__s->VtxBuffer).Size * 0x14);
      ImGui::MemFree((__s->VtxBuffer).Data);
    }
    (__s->VtxBuffer).Data = pIVar8;
    (__s->VtxBuffer).Capacity = iVar9;
  }
  else {
    pIVar8 = (ImDrawVert *)0x0;
  }
  (__s->VtxBuffer).Size = iVar1;
  pIVar5 = (this->VtxBuffer).Data;
  if (pIVar5 != (ImDrawVert *)0x0) {
    memcpy(pIVar8,pIVar5,(long)iVar1 * 0x14);
  }
  __s->Flags = this->Flags;
  return __s;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}